

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::Command::Validate(Command *this,string *shortprefix,string *longprefix)

{
  pointer ppBVar1;
  Base *pBVar2;
  Subparser *pSVar3;
  bool bVar4;
  int iVar5;
  ValidationError *this_00;
  pointer ppBVar6;
  anon_class_1_0_00000001 onValidationError;
  string local_1c8;
  ostringstream problem;
  
  iVar5 = (*(this->super_Group).super_Base._vptr_Base[2])();
  if ((char)iVar5 != '\0') {
    ppBVar1 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppBVar6 = (this->super_Group).children.
                   super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppBVar6 != ppBVar1; ppBVar6 = ppBVar6 + 1) {
      pBVar2 = *ppBVar6;
      iVar5 = (*pBVar2->_vptr_Base[6])(pBVar2);
      if ((char)iVar5 != '\0') {
        iVar5 = (*pBVar2->_vptr_Base[2])(pBVar2);
        if ((char)iVar5 == '\0') {
          Validate::anon_class_1_0_00000001::operator()(&onValidationError);
        }
      }
      (*pBVar2->_vptr_Base[3])(pBVar2,shortprefix,longprefix);
    }
    pSVar3 = this->subparser;
    if (pSVar3 != (Subparser *)0x0) {
      (*(pSVar3->super_Group).super_Base._vptr_Base[3])(pSVar3,shortprefix,longprefix);
      iVar5 = (*(this->subparser->super_Group).super_Base._vptr_Base[2])();
      if ((char)iVar5 == '\0') {
        Validate::anon_class_1_0_00000001::operator()(&onValidationError);
      }
    }
    if ((this->selectedCommand == (Command *)0x0) && (this->commandIsRequired == true)) {
      bVar4 = Group::HasCommand(&this->super_Group);
      if ((bVar4) || (this->subparserHasCommand == true)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
        std::operator<<((ostream *)&problem,"Command is required");
        this_00 = (ValidationError *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        ValidationError::ValidationError(this_00,&local_1c8);
        __cxa_throw(this_00,&ValidationError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortprefix, const std::string &longprefix) const override
            {
                if (!Matched())
                {
                    return;
                }

                auto onValidationError = [&]
                {
                    std::ostringstream problem;
                    problem << "Group validation failed somewhere!";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                };

                for (Base *child: Children())
                {
                    if (child->IsGroup() && !child->Matched())
                    {
                        onValidationError();
                    }

                    child->Validate(shortprefix, longprefix);
                }

                if (subparser != nullptr)
                {
                    subparser->Validate(shortprefix, longprefix);
                    if (!subparser->Matched())
                    {
                        onValidationError();
                    }
                }

                if (selectedCommand == nullptr && commandIsRequired && (Group::HasCommand() || subparserHasCommand))
                {
                    std::ostringstream problem;
                    problem << "Command is required";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                }
            }